

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O3

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  byte *__filename;
  char cVar2;
  int iVar3;
  uint uVar4;
  tm *ptVar5;
  FILE **ppFVar6;
  FILE *pFVar7;
  long lVar8;
  FILE *__stream;
  char *pcVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  timeval tVar15;
  char timebuf [20];
  curl_off_t xfer_id;
  char idsbuf [60];
  curl_off_t conn_id;
  char local_b8 [32];
  long local_98;
  long local_90;
  char *local_88;
  long local_80;
  ulong local_78 [8];
  long local_38;
  
  __stream = (FILE *)tool_stderr;
  config = *(GlobalConfig **)((long)userdata + 0x3b0);
  if ((config->field_0x63 & 0x20) == 0) {
    local_b8[0] = '\0';
  }
  else {
    tVar15 = tvrealnow();
    local_78[0] = tVar15.tv_sec;
    if (hms_for_sec_cached_tv_sec != local_78[0]) {
      ptVar5 = localtime((time_t *)local_78);
      curl_msnprintf(hms_for_sec_hms_buf,0xc,"%02d:%02d:%02d",ptVar5->tm_hour,ptVar5->tm_min,
                     ptVar5->tm_sec);
      hms_for_sec_cached_tv_sec = local_78[0];
    }
    curl_msnprintf(local_b8,0x14,"%s.%06ld ",hms_for_sec_hms_buf,tVar15.tv_usec);
  }
  if ((((handle == (CURL *)0x0) || ((config->field_0x63 & 0x40) == 0)) ||
      (iVar3 = curl_easy_getinfo(handle,0x60003f,&local_90), iVar3 != 0)) || (local_90 < 0)) {
    local_78[0] = local_78[0] & 0xffffffffffffff00;
  }
  else {
    iVar3 = curl_easy_getinfo(handle,0x600040,&local_38);
    if (local_38 < 0 || iVar3 != 0) {
      curl_msnprintf(local_78,0x3c,"[%ld-x] ",local_90);
    }
    else {
      curl_msnprintf(local_78,0x3c,"[%ld-%ld] ",local_90);
    }
  }
  pFVar7 = (FILE *)config->trace_stream;
  if (pFVar7 == (FILE *)0x0) {
    __filename = (byte *)config->trace_dump;
    if (*__filename == 0x2d) {
      if (__filename[1] != 0) {
LAB_0010ac12:
        pFVar7 = fopen64((char *)__filename,"w");
        config->trace_stream = (FILE *)pFVar7;
        config->field_0x63 = config->field_0x63 | 0x10;
        goto LAB_0010ac5f;
      }
      ppFVar6 = (FILE **)&stdout;
    }
    else {
      uVar4 = *__filename - 0x25;
      if (uVar4 == 0) {
        uVar4 = (uint)__filename[1];
      }
      if (uVar4 != 0) goto LAB_0010ac12;
      ppFVar6 = &tool_stderr;
    }
    pFVar7 = (FILE *)*ppFVar6;
    config->trace_stream = (FILE *)pFVar7;
  }
LAB_0010ac5f:
  if (pFVar7 != (FILE *)0x0) {
    __stream = pFVar7;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if ((config->field_0x64 & 4) != 0) {
        if (__stream == (FILE *)tool_stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_b8,(char *)local_78,type);
      }
      curl_mfprintf(__stream,"[%zu bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_b8,(char *)local_78,type);
      }
      fwrite(data,size,1,__stream);
      if (size == 0) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      cVar2 = data[size - 1];
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size == 0) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      lVar8 = size - 1;
      if (lVar8 == 0) {
        lVar10 = 0;
        lVar11 = 1;
      }
      else {
        lVar13 = 0;
        lVar11 = 0;
        lVar10 = 0;
        do {
          if (data[lVar11] == '\n') {
            if (tool_debug_cb::newl == false) {
              log_line_start((FILE *)__stream,local_b8,(char *)local_78,CURLINFO_HEADER_OUT);
            }
            pcVar9 = data + lVar10;
            lVar10 = lVar11 + 1;
            fwrite(pcVar9,lVar11 + lVar13 + 1,1,__stream);
            tool_debug_cb::newl = false;
          }
          lVar11 = lVar11 + 1;
          lVar13 = -lVar10;
        } while (lVar11 != lVar8);
        lVar11 = 1 - lVar10;
      }
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_b8,(char *)local_78,CURLINFO_HEADER_OUT);
      }
      fwrite(data + lVar10,lVar11 + lVar8,1,__stream);
      cVar2 = data[size - 1];
    }
    tool_debug_cb::newl = cVar2 != '\n';
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(__stream,"%s%s== Info: %.*s",local_b8,local_78,size & 0xffffffff,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar9 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar9 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar9 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar9 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar9 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar9 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010ad39_default;
  }
  curl_mfprintf(__stream,"%s%s%s, %zu bytes (0x%zx)\n",local_b8,local_78,pcVar9,size,size);
  if (size != 0) {
    local_98 = 0x10;
    if (tVar1 == TRACE_ASCII) {
      local_98 = 0x40;
    }
    local_80 = -local_98;
    local_88 = data + 2;
    uVar14 = 0;
    do {
      curl_mfprintf(__stream,"%04zx: ",uVar14);
      lVar8 = local_98;
      uVar12 = uVar14;
      if (tVar1 == TRACE_BIN) {
        do {
          if (uVar12 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar12]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar8 = lVar8 + -1;
          uVar12 = uVar12 + 1;
        } while (lVar8 != 0);
      }
      lVar8 = 0;
      lVar10 = 0;
      pcVar9 = local_88;
      do {
        if (size <= uVar14 + lVar10) break;
        if (tVar1 == TRACE_ASCII) {
          cVar2 = pcVar9[uVar14 - 2];
          if (((uVar14 + lVar10 + 1 < size) && (cVar2 == '\r')) &&
             (cVar2 = '\r', pcVar9[uVar14 - 1] == '\n')) {
            uVar14 = (uVar14 - lVar8) - 0x3e;
            break;
          }
          if (0x5e < (byte)(cVar2 - 0x20U)) {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
          if (((uVar14 + lVar10 + 2 < size) && (pcVar9[uVar14 - 1] == '\r')) &&
             (pcVar9[uVar14] == '\n')) {
            uVar14 = (uVar14 - lVar8) - 0x3d;
            break;
          }
        }
        else {
          cVar2 = pcVar9[uVar14 - 2];
          if (0x5e < (byte)(cVar2 - 0x20U)) {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + -1;
        pcVar9 = pcVar9 + 1;
      } while (local_80 != lVar8);
      fputc(10,__stream);
      uVar14 = uVar14 + local_98;
    } while (uVar14 < size);
  }
  fflush(__stream);
switchD_0010ad39_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = tool_stderr;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  /* largest signed 64-bit is: 9,223,372,036,854,775,807
   * max length in decimal: 1 + (6*3) = 19
   * formatted via TRC_IDS_FORMAT_IDS_2 this becomes 2 + 19 + 1 + 19 + 2 = 43
   * negative xfer-id are not printed, negative conn-ids use TRC_IDS_FORMAT_1
   */
  char idsbuf[60];
  curl_off_t xfer_id, conn_id;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvrealnow();
    msnprintf(timebuf, sizeof(timebuf), "%s.%06ld ",
              hms_for_sec(tv.tv_sec), (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(handle && config->traceids &&
     !curl_easy_getinfo(handle, CURLINFO_XFER_ID, &xfer_id) && xfer_id >= 0) {
    if(!curl_easy_getinfo(handle, CURLINFO_CONN_ID, &conn_id) &&
        conn_id >= 0) {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_2,
                xfer_id, conn_id);
    }
    else {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_1, xfer_id);
    }
  }
  else
    idsbuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = tool_stderr;
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        size_t st = 0;
        size_t i;
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              log_line_start(output, timebuf, idsbuf, type);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          log_line_start(output, timebuf, idsbuf, type);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n'));
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        log_line_start(output, timebuf, idsbuf, type);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n'));
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we are sending this debug trace
           to stderr or stdout, we do not display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty ||
           ((output != tool_stderr) && (output != stdout))) {
          if(!newl)
            log_line_start(output, timebuf, idsbuf, type);
          fprintf(output, "[%zu bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s%s== Info: %.*s", timebuf, idsbuf, (int)size, data);
    FALLTHROUGH();
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, idsbuf, text, output, (unsigned char *) data, size,
       config->tracetype, type);
  return 0;
}